

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void fs_serializer_metainfo_get_keys(void *serializer,char **keys)

{
  char *__dest;
  const_reference pvVar1;
  ulong uVar2;
  ulong uVar3;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mkeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  ser::MetainfoSet::keys_abi_cxx11_(&local_40,(MetainfoSet *)((long)serializer + 0x10));
  uVar2 = (ulong)((long)local_40.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  __n = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = __n;
  }
  for (; uVar3 != __n; __n = __n + 1) {
    __dest = keys[__n];
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&local_40,__n);
    strcpy(__dest,(pvVar1->_M_dataplus)._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void fs_serializer_metainfo_get_keys(void* serializer, char** keys)
{
    const std::vector<std::string> mkeys = reinterpret_cast<Serializer*>(serializer)->globalMetainfo().keys();
    const int N = mkeys.size();

    for (int i = 0; i < N; ++i)
    {
        std::strcpy(keys[i], mkeys.at(i).c_str());
    }
}